

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O1

int envy_bios_parse_hdtvtt(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  envy_bios_hdtvtt_entry *peVar6;
  uint16_t uVar7;
  int iVar8;
  uint uVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  char *__format;
  int iVar15;
  
  uVar2 = (bios->hdtvtt).offset;
  iVar3 = 0;
  if (uVar2 != 0) {
    if ((uint)uVar2 < bios->length) {
      (bios->hdtvtt).version = bios->data[(uint)uVar2];
      iVar15 = 0;
    }
    else {
      (bios->hdtvtt).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar15 = -0xe;
    }
    lVar11 = (ulong)(bios->hdtvtt).offset + 1;
    if ((uint)lVar11 < bios->length) {
      (bios->hdtvtt).hlen = bios->data[lVar11];
      iVar14 = 0;
    }
    else {
      (bios->hdtvtt).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar14 = -0xe;
    }
    lVar11 = (ulong)(bios->hdtvtt).offset + 2;
    if ((uint)lVar11 < bios->length) {
      (bios->hdtvtt).entriesnum = bios->data[lVar11];
      iVar4 = 0;
    }
    else {
      (bios->hdtvtt).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    lVar11 = (ulong)(bios->hdtvtt).offset + 3;
    if ((uint)lVar11 < bios->length) {
      (bios->hdtvtt).rlen = bios->data[lVar11];
      iVar8 = 0;
    }
    else {
      (bios->hdtvtt).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar8 = -0xe;
    }
    iVar3 = -0xe;
    if (((iVar14 == 0 && iVar15 == 0) && iVar4 == 0) && iVar8 == 0) {
      envy_bios_block(bios,(uint)(bios->hdtvtt).offset,
                      (uint)(bios->hdtvtt).entriesnum * (uint)(bios->hdtvtt).rlen +
                      (uint)(bios->hdtvtt).hlen,"HDTVTT",-1);
      if (((bios->hdtvtt).version & 0xfe) == 0x10) {
        bVar1 = (bios->hdtvtt).hlen;
        uVar12 = (ulong)bVar1;
        uVar10 = 4;
        if (9 < bVar1) {
          uVar10 = 10;
        }
        uVar9 = (uint)uVar10;
        if (uVar9 < bVar1 || uVar9 == bVar1) {
          uVar5 = (uint)(bios->hdtvtt).rlen;
          if (1 < uVar5) {
            if (uVar9 < bVar1) {
              fprintf(_stderr,"HDTVTT table header longer than expected [%d > %d]\n");
            }
            bVar1 = (bios->hdtvtt).rlen;
            if (2 < bVar1) {
              fprintf(_stderr,"HDTVTT table record longer than expected [%d > %d]\n",(ulong)bVar1,2)
              ;
            }
            uVar12 = (ulong)(bios->hdtvtt).entriesnum;
            peVar6 = (envy_bios_hdtvtt_entry *)calloc(uVar12,2);
            (bios->hdtvtt).entries = peVar6;
            if (peVar6 != (envy_bios_hdtvtt_entry *)0x0) {
              if (uVar12 != 0) {
                bVar1 = (bios->hdtvtt).rlen;
                uVar7 = (ushort)(bios->hdtvtt).hlen + (bios->hdtvtt).offset;
                uVar13 = 0;
                do {
                  peVar6[uVar13].offset = uVar7;
                  uVar7 = uVar7 + bVar1;
                  uVar13 = uVar13 + 1;
                } while (uVar12 != uVar13);
              }
              (bios->hdtvtt).valid = '\x01';
              return 0;
            }
            return -0xc;
          }
          __format = "HDTVTT table record too short [%d < %d]\n";
          uVar12 = (ulong)uVar5;
          uVar10 = 2;
        }
        else {
          __format = "HDTVTT table header too short [%d < %d]\n";
        }
        fprintf(_stderr,__format,uVar12,uVar10);
      }
      else {
        envy_bios_parse_hdtvtt_cold_1();
      }
      iVar3 = -0x16;
    }
  }
  return iVar3;
}

Assistant:

int envy_bios_parse_hdtvtt (struct envy_bios *bios) {
	struct envy_bios_hdtvtt *hdtvtt = &bios->hdtvtt;
	if (!hdtvtt->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, hdtvtt->offset, &hdtvtt->version);
	err |= bios_u8(bios, hdtvtt->offset+1, &hdtvtt->hlen);
	err |= bios_u8(bios, hdtvtt->offset+2, &hdtvtt->entriesnum);
	err |= bios_u8(bios, hdtvtt->offset+3, &hdtvtt->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, hdtvtt->offset, hdtvtt->hlen + hdtvtt->rlen * hdtvtt->entriesnum, "HDTVTT", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (hdtvtt->version) {
		case 0x10:
		case 0x11:
			wanthlen = 4;
			if (hdtvtt->hlen >= 10)
				wanthlen = 10;
			wantrlen = 2;
			break;
		default:
			ENVY_BIOS_ERR("Unknown HDTVTT table version %d.%d\n", hdtvtt->version >> 4, hdtvtt->version & 0xf);
			return -EINVAL;
	}
	if (hdtvtt->hlen < wanthlen) {
		ENVY_BIOS_ERR("HDTVTT table header too short [%d < %d]\n", hdtvtt->hlen, wanthlen);
		return -EINVAL;
	}
	if (hdtvtt->rlen < wantrlen) {
		ENVY_BIOS_ERR("HDTVTT table record too short [%d < %d]\n", hdtvtt->rlen, wantrlen);
		return -EINVAL;
	}
	if (hdtvtt->hlen > wanthlen) {
		ENVY_BIOS_WARN("HDTVTT table header longer than expected [%d > %d]\n", hdtvtt->hlen, wanthlen);
	}
	if (hdtvtt->rlen > wantrlen) {
		ENVY_BIOS_WARN("HDTVTT table record longer than expected [%d > %d]\n", hdtvtt->rlen, wantrlen);
	}
	hdtvtt->entries = calloc(hdtvtt->entriesnum, sizeof *hdtvtt->entries);
	if (!hdtvtt->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < hdtvtt->entriesnum; i++) {
		struct envy_bios_hdtvtt_entry *entry = &hdtvtt->entries[i];
		entry->offset = hdtvtt->offset + hdtvtt->hlen + hdtvtt->rlen * i;
	}
	hdtvtt->valid = 1;
	return 0;
}